

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O2

int __thiscall ON_wString::RemoveWhiteSpace(ON_wString *this,wchar_t *whitespace)

{
  wchar_t wVar1;
  bool bVar2;
  wchar_t *pwVar3;
  ON_Internal_Empty_wString *pOVar4;
  int iVar5;
  wchar_t *pwVar6;
  int iVar7;
  wchar_t *pwVar8;
  long lVar9;
  
  pwVar3 = this->m_s;
  if (pwVar3 == (wchar_t *)0x0) {
    iVar5 = 0;
  }
  else {
    pwVar6 = pwVar3 + pwVar3[-2];
    if ((whitespace == (wchar_t *)0x0) || (*whitespace == L'\0')) {
      lVar9 = 0;
      do {
        if (pwVar6 <= pwVar3) {
          return 0;
        }
        wVar1 = *pwVar3;
        lVar9 = lVar9 + 0x100000000;
      } while ((wVar1 != L'\x7f') && (pwVar3 = pwVar3 + 1, 0x1f < (uint)(wVar1 + L'\xffffffff')));
      CopyArray(this);
      pwVar6 = this->m_s;
      pwVar3 = pwVar6 + (lVar9 >> 0x20);
      pOVar4 = &empty_wstring;
      if (pwVar6 != (wchar_t *)0x0) {
        pOVar4 = (ON_Internal_Empty_wString *)(pwVar6 + -3);
      }
      pwVar8 = pwVar6 + (lVar9 >> 0x20) + -1;
      iVar7 = (pOVar4->header).string_length;
      pwVar6 = pwVar6 + iVar7;
      for (; pwVar3 < pwVar6; pwVar3 = pwVar3 + 1) {
        wVar1 = *pwVar3;
        if ((wVar1 < L'\x01') || (wVar1 != L'\x7f' && 0x20 < (uint)wVar1)) {
          *pwVar8 = wVar1;
          pwVar8 = pwVar8 + 1;
        }
      }
    }
    else {
      lVar9 = 0;
      do {
        if (pwVar6 <= pwVar3) {
          return 0;
        }
        wVar1 = *pwVar3;
        pwVar3 = pwVar3 + 1;
        bVar2 = IsWhiteSpaceHelper(wVar1,whitespace);
        lVar9 = lVar9 + 0x100000000;
      } while (!bVar2);
      CopyArray(this);
      pwVar6 = this->m_s;
      pwVar3 = pwVar6 + (lVar9 >> 0x20);
      pOVar4 = &empty_wstring;
      if (pwVar6 != (wchar_t *)0x0) {
        pOVar4 = (ON_Internal_Empty_wString *)(pwVar6 + -3);
      }
      pwVar8 = pwVar6 + (lVar9 >> 0x20) + -1;
      iVar7 = (pOVar4->header).string_length;
      pwVar6 = pwVar6 + iVar7;
      for (; pwVar3 < pwVar6; pwVar3 = pwVar3 + 1) {
        wVar1 = *pwVar3;
        bVar2 = IsWhiteSpaceHelper(wVar1,whitespace);
        if (!bVar2) {
          *pwVar8 = wVar1;
          pwVar8 = pwVar8 + 1;
        }
      }
    }
    *pwVar8 = L'\0';
    iVar5 = (int)((ulong)((long)pwVar6 - (long)pwVar8) >> 2);
    (pOVar4->header).string_length = iVar7 - iVar5;
  }
  return iVar5;
}

Assistant:

int ON_wString::RemoveWhiteSpace( const wchar_t* whitespace )
{
  wchar_t* s0;
  wchar_t* s1;
  wchar_t* s;
  int n;
  wchar_t c;

  if ( 0 == (s0 = m_s) )
    return 0;
  s1 = s0 + Length();
  if ( whitespace && *whitespace )
  {
    while( s0 < s1 )
    {
      if (IsWhiteSpaceHelper(*s0++,whitespace))
      {
        // need to modify this string
        n = ((int)(s0 - m_s)); // keep win64 happy with (int) cast
        CopyArray(); // may change m_s if string has multiple refs
        s0 = m_s + n;
        s = s0-1;
        s1 = m_s + Length();
        while ( s0 < s1 )
        {
          if ( !IsWhiteSpaceHelper(*s0,whitespace) )
          {
            *s++ = *s0;
          }
          s0++;
        }
        *s = 0;
        n = ((int)(s1 - s)); // keep win64 happy with (int) cast
        Header()->string_length -= n;
        return n;
      }
    }
  }
  else
  {
    while( s0 < s1 )
    {
      c = *s0++;
      if ( (1 <= c && c <= 32) || 127 == c )
      {
        // need to modify this string
        n = ((int)(s0 - m_s)); // keep win64 happy with (int) cast
        CopyArray(); // may change m_s if string has multiple refs
        s0 = m_s + n;
        s = s0-1;
        s1 = m_s + Length();
        while ( s0 < s1 )
        {
          c = *s0;
          if ( c < 1 || (c > 32 && 127 != c) )
          {
            *s++ = *s0;
          }
          s0++;
        }
        *s = 0;
        n = ((int)(s1 - s)); // keep win64 happy with (int) cast
        Header()->string_length -= n;
        return n;
      }
    }
  }
  return 0;
}